

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenAtomicCmpxchgSetReplacement
               (BinaryenExpressionRef expr,BinaryenExpressionRef replacementExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef replacementExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::AtomicCmpxchg>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<AtomicCmpxchg>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xc04,
                  "void BinaryenAtomicCmpxchgSetReplacement(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (replacementExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 3) = replacementExpr;
    return;
  }
  __assert_fail("replacementExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xc05,
                "void BinaryenAtomicCmpxchgSetReplacement(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenAtomicCmpxchgSetReplacement(
  BinaryenExpressionRef expr, BinaryenExpressionRef replacementExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<AtomicCmpxchg>());
  assert(replacementExpr);
  static_cast<AtomicCmpxchg*>(expression)->replacement =
    (Expression*)replacementExpr;
}